

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateImportElimination.cpp
# Opt level: O1

void __thiscall
wasm::DuplicateImportElimination::run(DuplicateImportElimination *this,Module *module)

{
  Function *__k;
  size_t sVar1;
  _Base_ptr p_Var2;
  char *pcVar3;
  pointer pNVar4;
  iterator iVar5;
  Function *pFVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  pointer pNVar9;
  pointer ppFVar10;
  undefined1 local_158 [8];
  ImportInfo imports;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  replacements;
  map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
  seen;
  pair<wasm::Name,_wasm::Name> pair;
  pointer pNStack_48;
  vector<wasm::Name,_std::allocator<wasm::Name>_> toRemove;
  
  ImportInfo::ImportInfo((ImportInfo *)local_158,module);
  replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&replacements;
  replacements._M_t._M_impl._0_4_ = 0;
  replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  replacements._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&seen;
  seen._M_t._M_impl._0_4_ = 0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pNStack_48 = (pointer)0x0;
  toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ppFVar10 = (pointer)imports.importedGlobals.
                      super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (ppFVar10 ==
        imports.importedFunctions.
        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
        Module::updateMaps(module);
        OptUtils::replaceFunctions
                  ((this->super_Pass).runner,module,
                   (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)&imports.importedTags.
                       super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
        pNVar4 = toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (pNVar9 = pNStack_48; pNVar9 != pNVar4; pNVar9 = pNVar9 + 1) {
          Module::removeFunction(module,(Name)(pNVar9->super_IString).str);
        }
      }
      if (pNStack_48 != (pointer)0x0) {
        operator_delete(pNStack_48,
                        (long)toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pNStack_48);
      }
      std::
      _Rb_tree<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>,_std::_Select1st<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>,_std::_Select1st<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
                   *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   *)&imports.importedTags.
                      super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      if (imports.importedMemories.
          super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(imports.importedMemories.
                        super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (long)imports.importedTags.
                              super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)imports.importedMemories.
                              super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (imports.importedTables.super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(imports.importedTables.
                        super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (long)imports.importedMemories.
                              super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)imports.importedTables.
                              super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (imports.importedFunctions.
          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(imports.importedFunctions.
                        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)imports.importedTables.
                              super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)imports.importedFunctions.
                              super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (imports.importedGlobals.
          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(imports.importedGlobals.
                        super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (long)imports.importedFunctions.
                              super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)imports.importedGlobals.
                              super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (imports.wasm != (Module *)0x0) {
        operator_delete(imports.wasm,
                        (long)imports.importedGlobals.
                              super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)imports.wasm);
      }
      return;
    }
    __k = *ppFVar10;
    seen._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (__k->super_Importable).module.super_IString.str._M_len;
    iVar5 = std::
            _Rb_tree<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>,_std::_Select1st<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
            ::find((_Rb_tree<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>,_std::_Select1st<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
                    *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (key_type *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (iVar5._M_node == (_Base_ptr)&seen) {
LAB_0085ea64:
      pmVar8 = std::
               map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
               ::operator[]((map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
                             *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pcVar3 = (__k->super_Importable).super_Named.name.super_IString.str._M_str;
      (pmVar8->super_IString).str._M_len =
           (__k->super_Importable).super_Named.name.super_IString.str._M_len;
      (pmVar8->super_IString).str._M_str = pcVar3;
    }
    else {
      sVar1 = *(size_t *)(iVar5._M_node + 2);
      p_Var2 = iVar5._M_node[2]._M_parent;
      pFVar6 = Module::getFunction(module,(Name)*(string_view *)(iVar5._M_node + 2));
      if ((pFVar6->type).id != ((Type *)&__k->type)->id) goto LAB_0085ea64;
      pmVar7 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)&imports.importedTags.
                                super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)__k);
      (pmVar7->super_IString).str._M_len = sVar1;
      (pmVar7->super_IString).str._M_str = (char *)p_Var2;
      if (toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start ==
          toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                  ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pNStack_48,
                   (iterator)
                   toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start,(Name *)__k);
      }
      else {
        pcVar3 = (__k->super_Importable).super_Named.name.super_IString.str._M_str;
        ((toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start)->super_IString).str._M_len =
             (__k->super_Importable).super_Named.name.super_IString.str._M_len;
        ((toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar3;
        toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start =
             toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
    }
    ppFVar10 = ppFVar10 + 1;
  } while( true );
}

Assistant:

void run(Module* module) override {
    ImportInfo imports(*module);
    std::map<Name, Name> replacements;
    std::map<std::pair<Name, Name>, Name> seen;
    std::vector<Name> toRemove;
    for (auto* func : imports.importedFunctions) {
      auto pair = std::pair{func->module, func->base};
      auto iter = seen.find(pair);
      if (iter != seen.end()) {
        auto previousName = iter->second;
        auto previousFunc = module->getFunction(previousName);
        // It is ok to import the same thing with multiple types; we can only
        // merge if the types match, of course.
        if (previousFunc->type == func->type) {
          replacements[func->name] = previousName;
          toRemove.push_back(func->name);
          continue;
        }
      }
      seen[pair] = func->name;
    }
    if (!replacements.empty()) {
      module->updateMaps();
      OptUtils::replaceFunctions(getPassRunner(), *module, replacements);
      for (auto name : toRemove) {
        module->removeFunction(name);
      }
    }
  }